

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::BasicWriter<wchar_t>::write_int<bool,fmt::FormatSpec>
          (BasicWriter<wchar_t> *this,bool value,FormatSpec spec)

{
  ThousandsSep thousands_sep;
  char code;
  undefined4 uVar1;
  uint uVar2;
  uint uVar3;
  CharPtr pwVar4;
  lconv *plVar5;
  UnsignedType n;
  uint prefix_size;
  undefined7 in_register_00000031;
  char *pcVar6;
  StringRef SVar7;
  char prefix [4];
  uint uStack_34;
  
  uVar1 = spec._20_4_;
  prefix[0] = '\0';
  prefix[1] = '\0';
  prefix[2] = '\0';
  prefix[3] = '\0';
  prefix_size = 0;
  if (((undefined1  [24])spec & (undefined1  [24])0x100000000) != (undefined1  [24])0x0) {
    prefix[0] = 0x2b;
    if (((undefined1  [24])spec & (undefined1  [24])0x200000000) == (undefined1  [24])0x0) {
      prefix[0] = 0x20;
    }
    prefix[1] = '\0';
    prefix[2] = '\0';
    prefix[3] = '\0';
    prefix_size = 1;
  }
  code = spec.type_;
  uVar2 = (uint)CONCAT71(in_register_00000031,value);
  spec._20_4_ = uVar1;
  if (spec.type_ == '\0') {
LAB_0012ef42:
    uVar2 = internal::count_digits(uVar2);
    pwVar4 = prepare_int_buffer<fmt::FormatSpec>(this,uVar2,&spec,prefix,prefix_size);
    internal::format_decimal<unsigned_int,wchar_t,fmt::internal::NoThousandsSep>
              (pwVar4 + 1,CONCAT71(in_register_00000031,value) & 0xffffffff,0);
    return;
  }
  uVar3 = prefix_size;
  if (spec.type_ != 'B') {
    if (spec.type_ == 'X') {
LAB_0012ef88:
      uVar2 = prefix_size;
      if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
        prefix[prefix_size] = '0';
        uVar2 = prefix_size | 2;
        prefix[(ulong)prefix_size + 1] = spec.type_;
      }
      pwVar4 = prepare_int_buffer<fmt::FormatSpec>(this,1,&spec,prefix,uVar2);
      pcVar6 = "0123456789ABCDEF";
      if (spec.type_ == 'x') {
        pcVar6 = "0123456789abcdef";
      }
      *pwVar4 = (int)pcVar6[value];
      return;
    }
    if (spec.type_ != 'b') {
      if (spec.type_ == 'x') goto LAB_0012ef88;
      if (spec.type_ == 'n') {
        uVar3 = internal::count_digits(uVar2);
        plVar5 = localeconv();
        SVar7 = internal::thousands_sep<lconv>(plVar5);
        pwVar4 = prepare_int_buffer<fmt::FormatSpec>
                           (this,(int)SVar7.size_ * ((uVar3 - 1) / 3) + uVar3,&spec,prefix,
                            prefix_size);
        thousands_sep._16_8_ = (ulong)uStack_34 << 0x20;
        thousands_sep.sep_ = SVar7;
        internal::format_decimal<unsigned_int,wchar_t,fmt::internal::ThousandsSep>
                  (pwVar4 + 1,uVar2,0,thousands_sep);
        return;
      }
      if (spec.type_ != 'o') {
        if (spec.type_ != 'd') {
          pcVar6 = "char";
          if (((undefined1  [24])spec & (undefined1  [24])0x1000000000) == (undefined1  [24])0x0) {
            pcVar6 = "integer";
          }
          internal::report_unknown_type(code,pcVar6);
        }
        goto LAB_0012ef42;
      }
      if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
        prefix[prefix_size] = '0';
        uVar3 = prefix_size + 1;
      }
      goto LAB_0012efe6;
    }
  }
  if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
    prefix[prefix_size] = '0';
    uVar3 = prefix_size | 2;
    prefix[(ulong)prefix_size + 1] = spec.type_;
  }
LAB_0012efe6:
  pwVar4 = prepare_int_buffer<fmt::FormatSpec>(this,1,&spec,prefix,uVar3);
  *pwVar4 = uVar2 | 0x30;
  return;
}

Assistant:

void BasicWriter<Char>::write_int(T value, Spec spec) {
  unsigned prefix_size = 0;
  typedef typename internal::IntTraits<T>::MainType UnsignedType;
  UnsignedType abs_value = static_cast<UnsignedType>(value);
  char prefix[4] = "";
  if (internal::is_negative(value)) {
    prefix[0] = '-';
    ++prefix_size;
    abs_value = 0 - abs_value;
  } else if (spec.flag(SIGN_FLAG)) {
    prefix[0] = spec.flag(PLUS_FLAG) ? '+' : ' ';
    ++prefix_size;
  }
  switch (spec.type()) {
  case 0: case 'd': {
    unsigned num_digits = internal::count_digits(abs_value);
    CharPtr p = prepare_int_buffer(num_digits, spec, prefix, prefix_size) + 1;
    internal::format_decimal(get(p), abs_value, 0);
    break;
  }
  case 'x': case 'X': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 4) != 0);
    Char *p = get(prepare_int_buffer(
      num_digits, spec, prefix, prefix_size));
    n = abs_value;
    const char *digits = spec.type() == 'x' ?
        "0123456789abcdef" : "0123456789ABCDEF";
    do {
      *p-- = digits[n & 0xf];
    } while ((n >>= 4) != 0);
    break;
  }
  case 'b': case 'B': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 1) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 1));
    } while ((n >>= 1) != 0);
    break;
  }
  case 'o': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG))
      prefix[prefix_size++] = '0';
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 3) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 7));
    } while ((n >>= 3) != 0);
    break;
  }
  case 'n': {
    unsigned num_digits = internal::count_digits(abs_value);
    fmt::StringRef sep = "";
#ifndef ANDROID
    sep = internal::thousands_sep(std::localeconv());
#endif
    unsigned size = static_cast<unsigned>(
          num_digits + sep.size() * ((num_digits - 1) / 3));
    CharPtr p = prepare_int_buffer(size, spec, prefix, prefix_size) + 1;
    internal::format_decimal(get(p), abs_value, 0, internal::ThousandsSep(sep));
    break;
  }
  default:
    internal::report_unknown_type(
      spec.type(), spec.flag(CHAR_FLAG) ? "char" : "integer");
    break;
  }
}